

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::to_string_abi_cxx11_(precise_measurement *measure,uint64_t match_flags)

{
  undefined1 uVar1;
  reference pvVar2;
  iterator iVar3;
  precise_measurement *in_RSI;
  string *in_RDI;
  double dVar4;
  precise_unit pVar5;
  string str;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdd0;
  __const_iterator __p;
  precise_unit *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long local_1a0 [2];
  ostream local_190 [384];
  precise_measurement *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  CLI::std::ios_base::precision((ios_base *)((long)local_1a0 + *(long *)(local_1a0[0] + -0x18)),0xc)
  ;
  __p._M_current = (char *)local_190;
  dVar4 = precise_measurement::value(local_10);
  std::ostream::operator<<(__p._M_current,dVar4);
  std::operator<<(local_190,' ');
  pVar5 = precise_measurement::units(local_10);
  to_string_abi_cxx11_(in_stack_fffffffffffffe08,(uint64_t)in_RDI);
  pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           front(in_stack_fffffffffffffdc0);
  uVar1 = isNumericalStartCharacter(*pvVar2);
  if ((bool)uVar1) {
    in_stack_fffffffffffffdc0 = &local_1d0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_stack_fffffffffffffdb8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffdc0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffdb8);
    iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pVar5.multiplier_,__p,pVar5.commodity_._3_1_);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffdd0),(char)((ulong)iVar3._M_current >> 0x38));
  }
  std::operator<<(local_190,(string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(in_stack_fffffffffffffdc0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return in_RDI;
}

Assistant:

std::string
    to_string(const precise_measurement& measure, std::uint64_t match_flags)
{
    std::stringstream ss;
    ss.precision(12);
    ss << measure.value();
    ss << ' ';
    auto str = to_string(measure.units(), match_flags);
    if (isNumericalStartCharacter(str.front())) {
        str.insert(str.begin(), '(');
        str.push_back(')');
    }
    ss << str;
    return ss.str();
}